

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Array<wchar_t> * __thiscall
kj::PathPtr::forWin32Api(Array<wchar_t> *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  String local_68;
  ArrayPtr<const_char> local_50;
  EncodingResult<kj::Array<wchar_t>_> local_40;
  undefined1 local_19;
  PathPtr *pPStack_18;
  bool absolute_local;
  PathPtr *this_local;
  
  local_19 = absolute;
  pPStack_18 = this;
  this_local = (PathPtr *)__return_storage_ptr__;
  toWin32StringImpl(&local_68,this,absolute,true);
  local_50 = String::operator_cast_to_ArrayPtr(&local_68);
  encodeWideString(&local_40,local_50,true);
  Array<wchar_t>::Array(__return_storage_ptr__,&local_40.super_Array<wchar_t>);
  EncodingResult<kj::Array<wchar_t>_>::~EncodingResult(&local_40);
  String::~String(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Array<wchar_t> PathPtr::forWin32Api(bool absolute) const {
  return encodeWideString(toWin32StringImpl(absolute, true), true);
}